

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskflow.hpp
# Opt level: O2

void __thiscall tf::Taskflow::~Taskflow(Taskflow *this)

{
  std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::~deque
            (&(this->_topologies).c);
  std::
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ::~vector(&(this->_graph).
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           );
  std::__cxx11::string::~string((string *)&this->_name);
  return;
}

Assistant:

~Taskflow() = default;